

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

schar print_dungeon(boolean bymenu,schar *rlev,xchar *rdgn)

{
  bool bVar1;
  schar sVar2;
  boolean bVar3;
  int iVar4;
  nh_menuitem *pnVar5;
  char *pcVar6;
  nh_menuitem *_item__10;
  nh_menuitem *_item__9;
  trap *trap;
  nh_menuitem *_item__8;
  nh_menuitem *_item__7;
  int local_7b0;
  int idx;
  int selected [1];
  int n;
  nh_menuitem *_item__6;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  menulist menu;
  lchoice lchoices;
  branch *br;
  dungeon *dptr;
  s_level *slev;
  char local_138 [7];
  boolean first;
  char buf [256];
  int local_28;
  int nlev;
  int last_level;
  int i;
  xchar *rdgn_local;
  schar *rlev_local;
  boolean bymenu_local;
  
  init_menulist((menulist *)&_item_);
  if (bymenu != '\0') {
    menu.size = 0;
    lchoices.dgn[0x1f8] = 'a';
  }
  br = (branch *)dungeons;
  for (nlev = 0; nlev < n_dgns; nlev = nlev + 1) {
    iVar4 = (int)(char)br[1].field_0x15;
    if (iVar4 < 2) {
      sprintf(local_138,"%s: level %d",br,(ulong)*(uint *)((long)&br[2].next + 4));
    }
    else {
      sprintf(local_138,"%s: levels %d to %d",br,(ulong)*(uint *)((long)&br[2].next + 4),
              (ulong)((*(int *)((long)&br[2].next + 4) + iVar4) - 1));
    }
    if (br[1].end1_up != '\x01') {
      if (br[1].end1_up == iVar4) {
        strcat(local_138,", entrance from below");
      }
      else {
        pcVar6 = eos(local_138);
        sprintf(pcVar6,", entrance on %d",
                (ulong)((*(int *)((long)&br[2].next + 4) + (int)br[1].end1_up) - 1));
      }
    }
    if (bymenu == '\0') {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
      }
      pnVar5 = _item_ + menu.items._4_4_;
      pnVar5->id = 0;
      pnVar5->role = MI_TEXT;
      pnVar5->accel = '\0';
      pnVar5->group_accel = '\0';
      pnVar5->selected = '\0';
      strcpy(pnVar5->caption,local_138);
    }
    else {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
      }
      pnVar5 = _item_ + menu.items._4_4_;
      pnVar5->id = 0;
      pnVar5->role = MI_HEADING;
      pnVar5->accel = '\0';
      pnVar5->group_accel = '\0';
      pnVar5->selected = '\0';
      strcpy(pnVar5->caption,local_138);
    }
    menu.items._4_4_ = menu.items._4_4_ + 1;
    local_28 = 0;
    for (dptr = (dungeon *)sp_levchn; dptr != (dungeon *)0x0; dptr = *(dungeon **)dptr->dname) {
      if (dptr->dname[8] == nlev) {
        print_branch((menulist *)&_item_,nlev,local_28,(int)dptr->dname[9],bymenu,
                     (lchoice *)&menu.size);
        sVar2 = depth((d_level *)(dptr->dname + 8));
        sprintf(local_138,"   %s: %d",dptr->dname + 10,(ulong)(uint)(int)sVar2);
        bVar3 = on_level((d_level *)(dptr->dname + 8),&dungeon_topology.d_stronghold_level);
        if (bVar3 != '\0') {
          pcVar6 = eos(local_138);
          sprintf(pcVar6," (tune %s)",tune);
        }
        if (bymenu == '\0') {
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
          }
          pnVar5 = _item_ + menu.items._4_4_;
          pnVar5->id = 0;
          pnVar5->role = MI_TEXT;
          pnVar5->accel = '\0';
          pnVar5->group_accel = '\0';
          pnVar5->selected = '\0';
          strcpy(pnVar5->caption,local_138);
        }
        else {
          if ((nlev == dungeon_topology.d_advcal_level.dnum) ||
             (nlev == dungeon_topology.d_knox_level.dnum)) {
            sVar2 = depth((d_level *)(dptr->dname + 8));
            lchoices.lev[(long)menu.size + -8] = sVar2;
            lchoices.dgn[(long)menu.size + -8] = '\0';
          }
          else {
            lchoices.lev[(long)menu.size + -8] = dptr->dname[9];
            lchoices.dgn[(long)menu.size + -8] = (xchar)nlev;
          }
          sVar2 = depth((d_level *)(dptr->dname + 8));
          lchoices.playerlev[(long)menu.size + -8] = sVar2;
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
          }
          pnVar5 = _item_ + menu.items._4_4_;
          pnVar5->id = menu.size + 1;
          pnVar5->role = MI_NORMAL;
          pnVar5->accel = lchoices.dgn[0x1f8];
          pnVar5->group_accel = '\0';
          pnVar5->selected = '\0';
          strcpy(pnVar5->caption,local_138);
          if (lchoices.dgn[0x1f8] == 'z') {
            lchoices.dgn[0x1f8] = 'A';
          }
          else if (lchoices.dgn[0x1f8] == 'Z') {
            lchoices.dgn[0x1f8] = 'a';
          }
          else {
            lchoices.dgn[0x1f8] = lchoices.dgn[0x1f8] + '\x01';
          }
          menu.size = menu.size + 1;
        }
        menu.items._4_4_ = menu.items._4_4_ + 1;
        local_28 = (int)dptr->dname[9];
      }
    }
    print_branch((menulist *)&_item_,nlev,local_28,0x20,bymenu,(lchoice *)&menu.size);
    br = (branch *)&br[2].id;
  }
  bVar1 = true;
  for (lchoices._1536_8_ = branches; lchoices._1536_8_ != 0;
      lchoices._1536_8_ = *(undefined8 *)lchoices._1536_8_) {
    if (*(char *)(lchoices._1536_8_ + 0x10) == n_dgns) {
      if (bVar1) {
        if (bymenu == '\0') {
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
          }
          pnVar5 = _item_ + menu.items._4_4_;
          pnVar5->id = 0;
          pnVar5->role = MI_TEXT;
          pnVar5->accel = '\0';
          pnVar5->group_accel = '\0';
          pnVar5->selected = '\0';
          strcpy(pnVar5->caption,"");
          menu.items._4_4_ = menu.items._4_4_ + 1;
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
          }
          pnVar5 = _item_ + menu.items._4_4_;
          pnVar5->id = 0;
          pnVar5->role = MI_TEXT;
          pnVar5->accel = '\0';
          pnVar5->group_accel = '\0';
          pnVar5->selected = '\0';
          strcpy(pnVar5->caption,"Floating branches");
          menu.items._4_4_ = menu.items._4_4_ + 1;
        }
        bVar1 = false;
      }
      pcVar6 = br_string(*(int *)(lchoices._1536_8_ + 0xc));
      sprintf(local_138,"   %s to %s",pcVar6);
      if (bymenu == '\0') {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        _selected = _item_ + menu.items._4_4_;
        _selected->id = 0;
        _selected->role = MI_TEXT;
        _selected->accel = '\0';
        _selected->group_accel = '\0';
        _selected->selected = '\0';
        strcpy(_selected->caption,local_138);
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
    }
  }
  if (bymenu == '\0') {
    bVar3 = Invocation_lev(&u.uz);
    if (bVar3 == '\0') {
      bVar3 = on_level(&u.uz,&dungeon_topology.d_earth_level);
      if (((bVar3 != '\0') ||
          (bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar3 != '\0')) ||
         ((bVar3 = on_level(&u.uz,&dungeon_topology.d_fire_level), bVar3 != '\0' ||
          (bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar3 != '\0')))) {
        for (_item__9 = (nh_menuitem *)level->lev_traps;
            (_item__9 != (nh_menuitem *)0x0 && ((_item__9->caption[0] & 0x1fU) != 0x12));
            _item__9 = *(nh_menuitem **)_item__9) {
        }
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _item_ + menu.items._4_4_;
        pnVar5->id = 0;
        pnVar5->role = MI_TEXT;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,"");
        menu.items._4_4_ = menu.items._4_4_ + 1;
        if (_item__9 == (nh_menuitem *)0x0) {
          sprintf(local_138,"No portal found.");
        }
        else {
          sprintf(local_138,"Portal @ (%d,%d), hero @ (%d,%d)",
                  (ulong)(uint)(int)_item__9->caption[1],(ulong)(uint)(int)_item__9->caption[2],
                  (ulong)(uint)(int)u.ux,(ulong)(uint)(int)u.uy);
        }
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _item_ + menu.items._4_4_;
        pnVar5->id = 0;
        pnVar5->role = MI_TEXT;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,local_138);
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
    }
    else {
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
      }
      pnVar5 = _item_ + menu.items._4_4_;
      pnVar5->id = 0;
      pnVar5->role = MI_TEXT;
      pnVar5->accel = '\0';
      pnVar5->group_accel = '\0';
      pnVar5->selected = '\0';
      strcpy(pnVar5->caption,"");
      menu.items._4_4_ = menu.items._4_4_ + 1;
      sprintf(local_138,"Invocation position @ (%d,%d), hero @ (%d,%d)",(ulong)(uint)(int)inv_pos.x,
              (ulong)(uint)(int)inv_pos.y,(ulong)(uint)(int)u.ux,(ulong)(uint)(int)u.uy);
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
      }
      pnVar5 = _item_ + menu.items._4_4_;
      pnVar5->id = 0;
      pnVar5->role = MI_TEXT;
      pnVar5->accel = '\0';
      pnVar5->group_accel = '\0';
      pnVar5->selected = '\0';
      strcpy(pnVar5->caption,local_138);
      menu.items._4_4_ = menu.items._4_4_ + 1;
    }
    display_menu(_item_,menu.items._4_4_,"Level teleport to where:",0,(int *)0x0);
    free(_item_);
    rlev_local._7_1_ = '\0';
  }
  else {
    idx = display_menu(_item_,menu.items._4_4_,"Level teleport to where:",1,&local_7b0);
    free(_item_);
    if (((idx < 1) || (local_7b0 = local_7b0 + -1, rlev == (schar *)0x0)) || (rdgn == (xchar *)0x0))
    {
      rlev_local._7_1_ = '\0';
    }
    else {
      *rlev = lchoices.lev[(long)local_7b0 + -8];
      *rdgn = lchoices.dgn[(long)local_7b0 + -8];
      rlev_local._7_1_ = lchoices.playerlev[(long)local_7b0 + -8];
    }
  }
  return rlev_local._7_1_;
}

Assistant:

schar print_dungeon(boolean bymenu, schar *rlev, xchar *rdgn)
{
    int     i, last_level, nlev;
    char    buf[BUFSZ];
    boolean first;
    s_level *slev;
    dungeon *dptr;
    branch  *br;
    struct lchoice lchoices;
    struct menulist menu;
    
    init_menulist(&menu);

    if (bymenu) {
	lchoices.idx = 0;
	lchoices.menuletter = 'a';
    }

    for (i = 0, dptr = dungeons; i < n_dgns; i++, dptr++) {
	nlev = dptr->num_dunlevs;
	if (nlev > 1)
	    sprintf(buf, "%s: levels %d to %d", dptr->dname, dptr->depth_start,
						dptr->depth_start + nlev - 1);
	else
	    sprintf(buf, "%s: level %d", dptr->dname, dptr->depth_start);

	/* Most entrances are uninteresting. */
	if (dptr->entry_lev != 1) {
	    if (dptr->entry_lev == nlev)
		strcat(buf, ", entrance from below");
	    else
		sprintf(eos(buf), ", entrance on %d",
			dptr->depth_start + dptr->entry_lev - 1);
	}
	if (bymenu) {
	    add_menuheading(&menu, buf);
	} else
	    add_menutext(&menu, buf);

	/*
	 * Circle through the special levels to find levels that are in
	 * this dungeon.
	 */
	for (slev = sp_levchn, last_level = 0; slev; slev = slev->next) {
	    if (slev->dlevel.dnum != i)
		continue;

	    /* print any branches before this level */
	    print_branch(&menu, i, last_level, slev->dlevel.dlevel,
			 bymenu, &lchoices);

	    sprintf(buf, "   %s: %d", slev->proto, depth(&slev->dlevel));
	    if (Is_stronghold(&slev->dlevel))
		sprintf(eos(buf), " (tune %s)", tune);
	    if (bymenu) {
		/* If other floating branches are added, this will need to change */
		if (i != advcal_level.dnum && i != knox_level.dnum) {
			lchoices.lev[lchoices.idx] = slev->dlevel.dlevel;
			lchoices.dgn[lchoices.idx] = i;
		} else {
			lchoices.lev[lchoices.idx] = depth(&slev->dlevel);
			lchoices.dgn[lchoices.idx] = 0;
		}
		lchoices.playerlev[lchoices.idx] = depth(&slev->dlevel);
		
		add_menuitem(&menu, lchoices.idx + 1, buf, lchoices.menuletter, FALSE);
		if (lchoices.menuletter == 'z') lchoices.menuletter = 'A';
		else if (lchoices.menuletter == 'Z') lchoices.menuletter = 'a';
		else lchoices.menuletter++;
		lchoices.idx++;
	    } else
		add_menutext(&menu, buf);

	    last_level = slev->dlevel.dlevel;
	}
	/* print branches after the last special level */
	print_branch(&menu, i, last_level, MAXLEVEL, bymenu, &lchoices);
    }

    /* Print out floating branches (if any). */
    for (first = TRUE, br = branches; br; br = br->next) {
	if (br->end1.dnum == n_dgns) {
	    if (first) {
	    	if (!bymenu) {
		    add_menutext(&menu, "");
		    add_menutext(&menu, "Floating branches");
		}
		first = FALSE;
	    }
	    sprintf(buf, "   %s to %s",
			br_string(br->type), dungeons[br->end2.dnum].dname);
	    if (!bymenu)
		add_menutext(&menu, buf);
	}
    }
    
    if (bymenu) {
    	int n;
	int selected[1];
	int idx;
	
	n = display_menu(menu.items, menu.icount, "Level teleport to where:",
			 PICK_ONE, selected);
	free(menu.items);
	if (n > 0) {
		idx = selected[0] - 1;
		if (rlev && rdgn) {
			*rlev = lchoices.lev[idx];
			*rdgn = lchoices.dgn[idx];
			return lchoices.playerlev[idx];
		}
	}
	return 0;
    }

    /* I hate searching for the invocation pos while debugging. -dean */
    if (Invocation_lev(&u.uz)) {
	add_menutext(&menu, "");
	sprintf(buf, "Invocation position @ (%d,%d), hero @ (%d,%d)",
		inv_pos.x, inv_pos.y, u.ux, u.uy);
	add_menutext(&menu, buf);
    }
    /*
     * The following is based on the assumption that the inter-level portals
     * created by the level compiler (not the dungeon compiler) only exist
     * one per level (currently true, of course).
     */
    else if (Is_earthlevel(&u.uz) || Is_waterlevel(&u.uz)
				|| Is_firelevel(&u.uz) || Is_airlevel(&u.uz)) {
	struct trap *trap;
	for (trap = level->lev_traps; trap; trap = trap->ntrap)
	    if (trap->ttyp == MAGIC_PORTAL)
		break;

	add_menutext(&menu, "");
	if (trap)
	    sprintf(buf, "Portal @ (%d,%d), hero @ (%d,%d)",
		trap->tx, trap->ty, u.ux, u.uy);
	else
	    sprintf(buf, "No portal found.");
	add_menutext(&menu, buf);
    }
    
    display_menu(menu.items, menu.icount, "Level teleport to where:", PICK_NONE, NULL);
    free(menu.items);
    return 0;
}